

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O3

void __thiscall
vkt::sr::anon_unknown_0::ShaderMatrixInstance::setupUniforms
          (ShaderMatrixInstance *this,Vec4 *param_1)

{
  OperationType OVar1;
  long lVar2;
  size_t dataSize;
  float *dataPtr;
  DataType dataType;
  undefined1 *puVar3;
  undefined1 *puVar4;
  float *dataPtr_00;
  float *dataPtr_01;
  float *pfVar5;
  undefined8 *data;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  undefined1 *puVar9;
  undefined1 *puVar10;
  undefined8 *puVar11;
  int inNdx;
  long lVar12;
  deUint32 local_84;
  long local_48;
  float *local_40;
  float *local_38;
  
  OVar1 = MatrixCaseUtils::getOperationType(this->m_op);
  local_48 = 1;
  if (OVar1 < OPERATIONTYPE_LAST) {
    local_48 = *(long *)(&DAT_00b1fc30 + (ulong)OVar1 * 8);
  }
  lVar12 = 0;
  pfVar5 = (float *)&sr::(anonymous_namespace)::s_constInMat4x4;
  pfVar6 = (float *)&sr::(anonymous_namespace)::s_constInMat4x3;
  pfVar7 = (float *)&sr::(anonymous_namespace)::s_constInMat4x2;
  pfVar8 = (float *)&sr::(anonymous_namespace)::s_constInMat3x4;
  dataPtr_00 = (float *)&sr::(anonymous_namespace)::s_constInMat3x3;
  dataPtr_01 = (float *)&sr::(anonymous_namespace)::s_constInMat3x2;
  local_38 = (float *)sr::(anonymous_namespace)::s_constInMat2x4;
  local_40 = (float *)&sr::(anonymous_namespace)::s_constInMat2x3;
  puVar9 = sr::(anonymous_namespace)::s_constInMat2x2;
  puVar10 = sr::(anonymous_namespace)::s_constInVec4;
  puVar4 = sr::(anonymous_namespace)::s_constInVec3;
  puVar3 = sr::(anonymous_namespace)::s_constInVec2;
  puVar11 = &sr::(anonymous_namespace)::s_constInFloat;
  local_84 = 0;
  do {
    lVar2 = 0x21c;
    if (lVar12 == 0) {
      lVar2 = 0x210;
    }
    if (*(int *)((long)&(((ShaderRenderCaseInstance *)
                         (&(this->super_ShaderRenderCaseInstance).m_clearColor + -3))->
                        super_TestInstance)._vptr_TestInstance + lVar2) != 1) goto LAB_005d1e97;
    switch(*(undefined4 *)
            ((long)(this->super_ShaderRenderCaseInstance).m_clearColor.m_data + lVar2 + -0x2c)) {
    case 1:
      dataSize = 4;
      data = puVar11;
      goto LAB_005d1e29;
    case 2:
      dataSize = 8;
      data = (undefined8 *)puVar3;
      goto LAB_005d1e29;
    case 3:
      dataSize = 0xc;
      data = (undefined8 *)puVar4;
      goto LAB_005d1e29;
    case 4:
      dataSize = 0x10;
      data = (undefined8 *)puVar10;
LAB_005d1e29:
      ShaderRenderCaseInstance::addUniform
                (&this->super_ShaderRenderCaseInstance,local_84,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,
                 dataSize,data);
      goto switchD_005d1d2e_default;
    case 5:
      dataType = TYPE_FLOAT_MAT2;
      dataPtr = (float *)puVar9;
      break;
    case 6:
      dataType = TYPE_FLOAT_MAT2X3;
      dataPtr = local_40;
      break;
    case 7:
      dataType = TYPE_FLOAT_MAT2X4;
      dataPtr = local_38;
      break;
    case 8:
      addMatrixUniform(this,local_84,TYPE_FLOAT_MAT3X2,dataPtr_01);
      goto switchD_005d1d2e_default;
    case 9:
      addMatrixUniform(this,local_84,TYPE_FLOAT_MAT3,dataPtr_00);
      goto switchD_005d1d2e_default;
    case 10:
      dataType = TYPE_FLOAT_MAT3X4;
      dataPtr = pfVar8;
      break;
    case 0xb:
      dataType = TYPE_FLOAT_MAT4X2;
      dataPtr = pfVar7;
      break;
    case 0xc:
      dataType = TYPE_FLOAT_MAT4X3;
      dataPtr = pfVar6;
      break;
    case 0xd:
      dataType = TYPE_FLOAT_MAT4;
      dataPtr = pfVar5;
      break;
    default:
      goto switchD_005d1d2e_default;
    }
    addMatrixUniform(this,local_84,dataType,dataPtr);
switchD_005d1d2e_default:
    local_84 = local_84 + 1;
LAB_005d1e97:
    lVar12 = lVar12 + 1;
    pfVar5 = pfVar5 + 0x10;
    pfVar6 = pfVar6 + 0xc;
    pfVar7 = pfVar7 + 8;
    pfVar8 = pfVar8 + 0xc;
    dataPtr_00 = dataPtr_00 + 9;
    dataPtr_01 = dataPtr_01 + 6;
    local_38 = local_38 + 8;
    local_40 = local_40 + 6;
    puVar9 = (undefined1 *)((long)puVar9 + 0x10);
    puVar10 = (undefined1 *)((long)puVar10 + 0x10);
    puVar4 = (undefined1 *)((long)puVar4 + 0xc);
    puVar3 = (undefined1 *)((long)puVar3 + 8);
    puVar11 = (undefined8 *)((long)puVar11 + 4);
    if (local_48 == lVar12) {
      return;
    }
  } while( true );
}

Assistant:

void ShaderMatrixInstance::setupUniforms (const tcu::Vec4&)
{
	const int	numInputs		= isOperationBinary(m_op) ? 2 : 1;
	deUint32	uniformBinding	= 0;

	for (int inNdx = 0; inNdx < numInputs; inNdx++)
	{
		const ShaderInput& in = inNdx > 0 ? m_in1 : m_in0;

		if (in.inputType == INPUTTYPE_UNIFORM)
		{
			switch (in.dataType)
			{
				case TYPE_FLOAT:		addUniform(uniformBinding, vk::VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, sizeof(float), &s_constInFloat[inNdx]);					break;
				case TYPE_FLOAT_VEC2:	addUniform(uniformBinding, vk::VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, s_constInVec2[inNdx]);			break;
				case TYPE_FLOAT_VEC3:	addUniform(uniformBinding, vk::VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, s_constInVec3[inNdx]);			break;
				case TYPE_FLOAT_VEC4:	addUniform(uniformBinding, vk::VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, s_constInVec4[inNdx]);			break;
				// \note GLES3 supports transpose in matrix upload.
				case TYPE_FLOAT_MAT2:	addMatrixUniform(uniformBinding, in.dataType, s_constInMat2x2[inNdx]);	break;
				case TYPE_FLOAT_MAT2X3:	addMatrixUniform(uniformBinding, in.dataType, s_constInMat2x3[inNdx]);	break;
				case TYPE_FLOAT_MAT2X4:	addMatrixUniform(uniformBinding, in.dataType, s_constInMat2x4[inNdx]);	break;
				case TYPE_FLOAT_MAT3X2:	addMatrixUniform(uniformBinding, in.dataType, s_constInMat3x2[inNdx]);	break;
				case TYPE_FLOAT_MAT3:	addMatrixUniform(uniformBinding, in.dataType, s_constInMat3x3[inNdx]);	break;
				case TYPE_FLOAT_MAT3X4:	addMatrixUniform(uniformBinding, in.dataType, s_constInMat3x4[inNdx]);	break;
				case TYPE_FLOAT_MAT4X2:	addMatrixUniform(uniformBinding, in.dataType, s_constInMat4x2[inNdx]);	break;
				case TYPE_FLOAT_MAT4X3:	addMatrixUniform(uniformBinding, in.dataType, s_constInMat4x3[inNdx]);	break;
				case TYPE_FLOAT_MAT4:	addMatrixUniform(uniformBinding, in.dataType, s_constInMat4x4[inNdx]);	break;
				default:
					DE_ASSERT(false);
			}
			uniformBinding++;
		}
	}
}